

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorclock.h
# Opt level: O0

void __thiscall
VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
          (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this,
          VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *other)

{
  TID tid;
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  VC_ID VVar4;
  iterator local_38;
  undefined1 local_28 [8];
  const_iterator it;
  VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *other_local;
  VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this_local;
  
  it.inner_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)other;
  _local_28 = (iterator)
              phmap::container_internal::
              raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              ::begin((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                       *)other);
  while( true ) {
    local_38 = (iterator)
               phmap::container_internal::
               raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               ::end((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                      *)it.inner_.field_1.slot_);
    bVar2 = phmap::container_internal::operator!=
                      ((const_iterator *)local_28,(const_iterator *)&local_38);
    if (!bVar2) break;
    ppVar3 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::const_iterator::operator->((const_iterator *)local_28);
    uVar1 = ppVar3->second;
    ppVar3 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::const_iterator::operator->((const_iterator *)local_28);
    VVar4 = get_id_by_tid(this,ppVar3->first);
    if (VVar4 < uVar1) {
      ppVar3 = phmap::container_internal::
               raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               ::const_iterator::operator->((const_iterator *)local_28);
      tid = ppVar3->first;
      ppVar3 = phmap::container_internal::
               raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               ::const_iterator::operator->((const_iterator *)local_28);
      update(this,tid,ppVar3->second);
    }
    phmap::container_internal::
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
    ::const_iterator::operator++((const_iterator *)local_28,0);
  }
  return;
}

Assistant:

void update(const VectorClock& other) {
    for (auto it = other.vc.begin(); it != other.vc.end(); it++) {
      if (it->second > get_id_by_tid(it->first)) {
        update(it->first, it->second);
      }
    }
  }